

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O2

void __thiscall
RhombicCode::sweepFullVertex
          (RhombicCode *this,int vertexIndex,vstr *sweepEdges,string *sweepDirection,
          vstr *upEdgeDirections)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_01;
  __type _Var1;
  result_type_conflict rVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ulong uVar4;
  invalid_argument *this_00;
  ulong uVar5;
  pointer __lhs;
  pointer pbVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  allocator_type local_1e1 [13];
  int local_1d4;
  vint vertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __rhs_01 = (upEdgeDirections->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __rhs = __rhs_01 + 1;
  __rhs_00 = __rhs_01 + 2;
  pbVar6 = (sweepEdges->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1d4 = vertexIndex;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (pbVar6,(sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish,sweepDirection);
  __lhs = (sweepEdges->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(sweepEdges->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs;
  if (uVar5 == 0x80) {
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_01);
    std::__cxx11::string::string(local_170,(string *)__rhs_01);
    __l._M_len = 3;
    __l._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__l,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs);
    std::__cxx11::string::string(local_170,(string *)__rhs);
    __l_00._M_len = 3;
    __l_00._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,__l_00,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_00);
    std::__cxx11::string::string(local_170,(string *)__rhs_00);
    __l_01._M_len = 3;
    __l_01._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,__l_01,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    goto LAB_001156e1;
  }
  uVar4 = (long)_Var3._M_current - (long)pbVar6;
  if (uVar4 < uVar5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(sweepEdges,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)__lhs + uVar4));
    pbVar6 = (sweepEdges->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 == 0x40) {
      rVar2 = std::uniform_int_distribution<int>::operator()
                        (&(this->super_Code).distInt0To1,&(this->super_Code).rnEngine);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(sweepEdges,
              (sweepEdges->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + rVar2);
      pbVar6 = (sweepEdges->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    _Var1 = std::operator==(pbVar6,__rhs_01);
    if (!_Var1) {
      _Var1 = std::operator==((sweepEdges->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,__rhs_00);
      if (_Var1) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
        std::__cxx11::string::string(local_190,(string *)__rhs_00);
        std::__cxx11::string::string(local_170,(string *)__rhs_00);
        __l_07._M_len = 3;
        __l_07._M_array = &local_1b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a8,__l_07,local_1e1);
        Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        lVar7 = 0x40;
        do {
          std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
        Code::localFlip(&this->super_Code,&vertices);
        goto LAB_001156e1;
      }
      _Var1 = std::operator==((sweepEdges->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,__rhs);
      if (_Var1) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
        std::__cxx11::string::string(local_190,(string *)__rhs);
        std::__cxx11::string::string(local_170,(string *)__rhs);
        __l_10._M_len = 3;
        __l_10._M_array = &local_1b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_c0,__l_10,local_1e1);
        Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c0);
        lVar7 = 0x40;
        do {
          std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
        Code::localFlip(&this->super_Code,&vertices);
        goto LAB_001156e1;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid up-edges.");
      goto LAB_00115e84;
    }
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_01);
    std::__cxx11::string::string(local_170,(string *)__rhs_01);
    __l_02._M_len = 3;
    __l_02._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_90,__l_02,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    goto LAB_001156e1;
  }
  if (uVar5 == 0x60) {
    rVar2 = std::uniform_int_distribution<int>::operator()
                      (&(this->super_Code).distInt0To2,&(this->super_Code).rnEngine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(sweepEdges,
            (sweepEdges->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + rVar2);
    __lhs = (sweepEdges->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  }
  _Var1 = std::operator==(__lhs,__rhs_01);
  if (_Var1) {
    _Var1 = std::operator==((sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,__rhs_00);
    if (!_Var1) goto LAB_00115859;
LAB_00115885:
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_01);
    std::__cxx11::string::string(local_170,(string *)__rhs_01);
    __l_03._M_len = 3;
    __l_03._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d8,__l_03,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_00);
    std::__cxx11::string::string(local_170,(string *)__rhs_00);
    __l_04._M_len = 3;
    __l_04._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0,__l_04,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    goto LAB_001156e1;
  }
LAB_00115859:
  _Var1 = std::operator==((sweepEdges->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,__rhs_00);
  if (_Var1) {
    _Var1 = std::operator==((sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,__rhs_01);
    if (_Var1) goto LAB_00115885;
  }
  _Var1 = std::operator==((sweepEdges->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,__rhs_01);
  if (_Var1) {
    _Var1 = std::operator==((sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,__rhs);
    if (!_Var1) goto LAB_001159ed;
LAB_00115a19:
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_01);
    std::__cxx11::string::string(local_170,(string *)__rhs_01);
    __l_05._M_len = 3;
    __l_05._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_108,__l_05,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs);
    std::__cxx11::string::string(local_170,(string *)__rhs);
    __l_06._M_len = 3;
    __l_06._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_120,__l_06,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_120);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    goto LAB_001156e1;
  }
LAB_001159ed:
  _Var1 = std::operator==((sweepEdges->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,__rhs);
  if (_Var1) {
    _Var1 = std::operator==((sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,__rhs_01);
    if (_Var1) goto LAB_00115a19;
  }
  _Var1 = std::operator==((sweepEdges->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,__rhs);
  if (_Var1) {
    _Var1 = std::operator==((sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,__rhs_00);
    if (!_Var1) goto LAB_00115c2d;
LAB_00115c59:
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs);
    std::__cxx11::string::string(local_170,(string *)__rhs);
    __l_08._M_len = 3;
    __l_08._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_138,__l_08,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::string((string *)&local_1b0,(string *)sweepDirection);
    std::__cxx11::string::string(local_190,(string *)__rhs_00);
    std::__cxx11::string::string(local_170,(string *)__rhs_00);
    __l_09._M_len = 3;
    __l_09._M_array = &local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_150,__l_09,local_1e1);
    Code::faceVertices(&vertices,&this->super_Code,local_1d4,&local_150);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_150);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    Code::localFlip(&this->super_Code,&vertices);
LAB_001156e1:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertices.super__Vector_base<int,_std::allocator<int>_>);
    return;
  }
LAB_00115c2d:
  _Var1 = std::operator==((sweepEdges->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,__rhs_00);
  if (_Var1) {
    _Var1 = std::operator==((sweepEdges->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,__rhs);
    if (_Var1) goto LAB_00115c59;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid up-edges.");
LAB_00115e84:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RhombicCode::sweepFullVertex(const int vertexIndex, vstr &sweepEdges, const std::string &sweepDirection, const vstr &upEdgeDirections)
{
    // std::cout << "Sweep of coordinate = " << lattice->indexToCoordinate(vertexIndex) << " ... ";
    auto &edge0 = upEdgeDirections[0];
    auto &edge1 = upEdgeDirections[1];
    auto &edge2 = upEdgeDirections[2];
    // cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
    auto sweepDirectionIndex = std::distance(sweepEdges.begin(), std::find(sweepEdges.begin(), sweepEdges.end(), sweepDirection));
    if (sweepEdges.size() == 4)
    {
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
        try
        {
            vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
            localFlip(vertices);
        }
        catch (const std::invalid_argument &e)
        {
            // std::cerr << "WARNING: " << e.what() << std::endl;
        }
    }
    else if (sweepDirectionIndex < sweepEdges.size())
    {
        sweepEdges.erase(sweepEdges.begin() + sweepDirectionIndex);
        if (sweepEdges.size() == 2)
        {
            // int delIndex = distInt0To1(mt);
            int delIndex = distInt0To1(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if (sweepEdges[0] == edge0)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge2)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if (sweepEdges[0] == edge1)
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    else
    {
        if (sweepEdges.size() == 3)
        {
            // int delIndex = distInt0To2(mt);
            int delIndex = distInt0To2(rnEngine);
            sweepEdges.erase(sweepEdges.begin() + delIndex);
        }
        if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge2) ||
            (sweepEdges[0] == edge2 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge0 && sweepEdges[1] == edge1) ||
                 (sweepEdges[0] == edge1 && sweepEdges[1] == edge0))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge0, edge0});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else if ((sweepEdges[0] == edge1 && sweepEdges[1] == edge2) ||
                 (sweepEdges[0] == edge2 && sweepEdges[1] == edge1))
        {
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge1, edge1});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
            try
            {
                vint vertices = faceVertices(vertexIndex, {sweepDirection, edge2, edge2});
                localFlip(vertices);
            }
            catch (const std::invalid_argument &e)
            {
                // std::cerr << "WARNING: " << e.what() << std::endl;
            }
        }
        else
        {
            throw std::invalid_argument("Invalid up-edges.");
        }
    }
    // std::cout << "Successful." << std::endl;
}